

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetCullModeLiteralName(CULL_MODE CullMode,bool GetEnumString)

{
  Char *Message;
  char (*in_R8) [2];
  int local_3c;
  undefined1 local_38 [8];
  string msg;
  bool GetEnumString_local;
  char *pcStack_10;
  CULL_MODE CullMode_local;
  
  switch(CullMode) {
  case CULL_MODE_UNDEFINED:
    pcStack_10 = "undefined";
    if (GetEnumString) {
      pcStack_10 = "CULL_MODE_UNDEFINED";
    }
    break;
  case CULL_MODE_NONE:
    pcStack_10 = "none";
    if (GetEnumString) {
      pcStack_10 = "CULL_MODE_NONE";
    }
    break;
  case CULL_MODE_FRONT:
    pcStack_10 = "front";
    if (GetEnumString) {
      pcStack_10 = "CULL_MODE_FRONT";
    }
    break;
  case CULL_MODE_BACK:
    pcStack_10 = "back";
    if (GetEnumString) {
      pcStack_10 = "CULL_MODE_BACK";
    }
    break;
  default:
    local_3c = (int)(char)CullMode;
    msg.field_2._M_local_buf[0xe] = GetEnumString;
    msg.field_2._M_local_buf[0xf] = CullMode;
    FormatString<char[23],int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected cull mode (",(char (*) [23])&local_3c,
               (int *)0xf65f2d,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetCullModeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x428);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetCullModeLiteralName(CULL_MODE CullMode, bool GetEnumString)
{
    static_assert(CULL_MODE_NUM_MODES == 4, "Please update the switch below to handle the new cull mode");
    switch (CullMode)
    {
        // clang-format off
        case CULL_MODE_UNDEFINED: return GetEnumString ? "CULL_MODE_UNDEFINED" : "undefined";
        case CULL_MODE_NONE:      return GetEnumString ? "CULL_MODE_NONE"      : "none";
        case CULL_MODE_FRONT:     return GetEnumString ? "CULL_MODE_FRONT"     : "front";
        case CULL_MODE_BACK:      return GetEnumString ? "CULL_MODE_BACK"      : "back";
        // clang-format on
        default:
            UNEXPECTED("Unexpected cull mode (", static_cast<int>(CullMode), ")");
            return "UNKNOWN";
    }
}